

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int compression_end_ppmd(archive *a,la_zstream *lastrm)

{
  void *__ptr;
  
  __ptr = lastrm->real_stream;
  Ppmd7_Free((CPpmd7 *)((long)__ptr + 8),&g_szalloc);
  free(*(void **)((long)__ptr + 0x4b28));
  free(__ptr);
  lastrm->real_stream = (void *)0x0;
  lastrm->valid = 0;
  return 0;
}

Assistant:

static int
compression_end_ppmd(struct archive *a, struct la_zstream *lastrm)
{
	struct ppmd_stream *strm;

	(void)a; /* UNUSED */

	strm = (struct ppmd_stream *)lastrm->real_stream;
	__archive_ppmd7_functions.Ppmd7_Free(&strm->ppmd7_context, &g_szalloc);
	free(strm->buff);
	free(strm);
	lastrm->real_stream = NULL;
	lastrm->valid = 0;
	return (ARCHIVE_OK);
}